

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::anon_unknown_0::DotsToColons
                   (string *__return_storage_ptr__,string *name)

{
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,".",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"::",&local_71);
  StringReplace(__return_storage_ptr__,name,&local_38,&local_70,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

string DotsToColons(const string& name) {
  return StringReplace(name, ".", "::", true);
}